

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.hpp
# Opt level: O0

void __thiscall
msgpack::v1::packer<msgpack::v1::sbuffer>::pack_imp_int64<long>
          (packer<msgpack::v1::sbuffer> *this,long d)

{
  ulong in_RSI;
  size_t in_RDI;
  uint64_t val_5;
  char buf_8 [9];
  uint32_t val_4;
  char buf_7 [5];
  uint16_t val_3;
  char buf_6 [3];
  char buf_5 [2];
  char buf_4;
  char buf_3 [2];
  uint16_t val_2;
  char buf_2 [3];
  uint32_t val_1;
  char buf_1 [5];
  uint64_t val;
  char buf [9];
  char *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  
  if ((long)in_RSI < -0x20) {
    if ((long)in_RSI < -0x8000) {
      if ((long)in_RSI < -0x80000000) {
        append_buffer((packer<msgpack::v1::sbuffer> *)
                      CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98,in_RDI);
      }
      else {
        ntohl((uint32_t)in_RSI);
        append_buffer((packer<msgpack::v1::sbuffer> *)
                      CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98,in_RDI);
      }
    }
    else if ((long)in_RSI < -0x80) {
      ntohs((uint16_t)in_RSI);
      append_buffer((packer<msgpack::v1::sbuffer> *)
                    CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff98,in_RDI);
    }
    else {
      take8_64<long>(in_RSI);
      append_buffer((packer<msgpack::v1::sbuffer> *)
                    CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff98,in_RDI);
    }
  }
  else if ((long)in_RSI < 0x80) {
    take8_64<long>(in_RSI);
    append_buffer((packer<msgpack::v1::sbuffer> *)
                  CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98,in_RDI);
  }
  else if ((long)in_RSI < 0x10000) {
    if ((long)in_RSI < 0x100) {
      take8_64<long>(in_RSI);
      append_buffer((packer<msgpack::v1::sbuffer> *)
                    CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff98,in_RDI);
    }
    else {
      ntohs((uint16_t)in_RSI);
      append_buffer((packer<msgpack::v1::sbuffer> *)
                    CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff98,in_RDI);
    }
  }
  else if ((long)in_RSI < 0x100000000) {
    ntohl((uint32_t)in_RSI);
    append_buffer((packer<msgpack::v1::sbuffer> *)
                  CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98,in_RDI);
  }
  else {
    append_buffer((packer<msgpack::v1::sbuffer> *)CONCAT17(0xcf,in_stack_ffffffffffffffa0),
                  (char *)(in_RSI << 0x38 | (in_RSI & 0xff00) << 0x28 | (in_RSI & 0xff0000) << 0x18
                           | (in_RSI & 0xff000000) << 8 | in_RSI >> 8 & 0xff000000 |
                           in_RSI >> 0x18 & 0xff0000 | in_RSI >> 0x28 & 0xff00 | in_RSI >> 0x38),
                  in_RDI);
  }
  return;
}

Assistant:

inline void packer<Stream>::pack_imp_int64(T d)
{
    if(d < -(1LL<<5)) {
        if(d < -(1LL<<15)) {
            if(d < -(1LL<<31)) {
                /* signed 64 */
                char buf[9];
                buf[0] = static_cast<char>(0xd3u); _msgpack_store64(&buf[1], d);
                append_buffer(buf, 9);
            } else {
                /* signed 32 */
                char buf[5];
                buf[0] = static_cast<char>(0xd2u); _msgpack_store32(&buf[1], static_cast<int32_t>(d));
                append_buffer(buf, 5);
            }
        } else {
            if(d < -(1<<7)) {
                /* signed 16 */
                char buf[3];
                buf[0] = static_cast<char>(0xd1u); _msgpack_store16(&buf[1], static_cast<int16_t>(d));
                append_buffer(buf, 3);
            } else {
                /* signed 8 */
                char buf[2] = {static_cast<char>(0xd0u), take8_64(d)};
                append_buffer(buf, 2);
            }
        }
    } else if(d < (1<<7)) {
        /* fixnum */
        char buf = take8_64(d);
        append_buffer(&buf, 1);
    } else {
        if(d < (1LL<<16)) {
            if(d < (1<<8)) {
                /* unsigned 8 */
                char buf[2] = {static_cast<char>(0xccu), take8_64(d)};
                append_buffer(buf, 2);
            } else {
                /* unsigned 16 */
                char buf[3];
                buf[0] = static_cast<char>(0xcdu); _msgpack_store16(&buf[1], static_cast<uint16_t>(d));
                append_buffer(buf, 3);
            }
        } else {
            if(d < (1LL<<32)) {
                /* unsigned 32 */
                char buf[5];
                buf[0] = static_cast<char>(0xceu); _msgpack_store32(&buf[1], static_cast<uint32_t>(d));
                append_buffer(buf, 5);
            } else {
                /* unsigned 64 */
                char buf[9];
                buf[0] = static_cast<char>(0xcfu); _msgpack_store64(&buf[1], d);
                append_buffer(buf, 9);
            }
        }
    }
}